

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.hpp
# Opt level: O1

Score Search::search<(Nodetype)0>(position *pos,int16 alpha,int16 beta,U16 depth,node *stack)

{
  value_type *pvVar1;
  int *piVar2;
  Searchthread *t;
  pointer pRVar3;
  double dVar4;
  Score SVar5;
  value_type *pvVar6;
  U8 UVar7;
  U8 UVar8;
  Score SVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  U16 depth_00;
  Score SVar13;
  long lVar14;
  ostream *poVar15;
  undefined7 extraout_var;
  uint uVar16;
  uint uVar17;
  undefined6 in_register_0000000a;
  ulong uVar18;
  short sVar19;
  ushort uVar20;
  Move *m;
  Score SVar21;
  ushort uVar22;
  byte bVar23;
  Score SVar25;
  short sVar26;
  short sVar27;
  Score SVar28;
  ulong uVar29;
  Move *__x;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  float __x_00;
  Move move;
  bool pvNode;
  short local_268;
  Move local_263;
  uint local_260;
  Move local_25b;
  ulong local_258;
  Score bestScore;
  undefined1 local_248;
  undefined1 local_247;
  Move pre_pre_move;
  Move pre_move;
  Score ttvalue;
  Rootmove *local_228;
  undefined4 local_220;
  uint local_21c;
  undefined4 local_218;
  node *local_210;
  ulong local_208;
  Score local_200;
  Score local_1fc;
  string local_1f8;
  Score local_1d8;
  uint local_1d4;
  Score local_1d0;
  vector<Move,_std::allocator<Move>_> quiets;
  Moveorder mvs;
  Move pv [68];
  position *ppVar24;
  
  local_260 = (uint)CONCAT62(in_register_0000000a,depth);
  if (UCI_SIGNALS.stop) {
    return draw;
  }
  if (beta <= alpha) {
    __assert_fail("alpha < beta",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/DoubleEspresso[P]chess/src/search.hpp"
                  ,0x139,"Score Search::search(position &, int16, int16, U16, node *) [type = root]"
                 );
  }
  SVar21 = (Score)alpha;
  bestScore = ninf;
  local_263.f = '\0';
  local_263.t = '\0';
  local_263.type = '\x11';
  local_25b.f = '\0';
  local_25b.t = '\0';
  local_25b.type = '\x11';
  lVar14 = 2;
  do {
    *(undefined2 *)((long)pv + lVar14 + -2) = 0;
    (&pv[0].f)[lVar14] = '\x11';
    lVar14 = lVar14 + 3;
  } while (lVar14 != 0xce);
  ttvalue = ninf;
  bVar10 = position::in_check(pos);
  quiets.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  quiets.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  quiets.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  stack->in_check = bVar10;
  uVar16 = *(int *)(stack + -1) + 1;
  stack->ply = (U16)uVar16;
  uVar16 = uVar16 & 0xffff;
  sVar19 = (short)*(int *)(stack + -1);
  bVar31 = sVar19 == 0;
  if (bVar31) {
    if ((selDepth <= (int)uVar16) && (pos->thread_id == 0)) {
      selDepth = selDepth + 1;
    }
  }
  else if (!bVar10) {
    bVar11 = position::is_draw(pos);
    SVar25 = draw;
    if (bVar11) goto LAB_0012945c;
  }
  SVar25 = mate - uVar16;
  SVar5 = (int)beta;
  if (SVar25 < beta) {
    SVar5 = SVar25;
  }
  sVar26 = (short)SVar5;
  if (SVar21 < SVar25) {
    SVar25 = uVar16 + mated;
    if (SVar21 < SVar25) {
      SVar21 = SVar25;
    }
    local_268 = (short)SVar21;
    bVar11 = SVar25 < sVar26;
  }
  else {
    bVar11 = false;
    local_268 = alpha;
  }
  if (!bVar11) goto LAB_0012945c;
  mvs.m_captures.super___shared_ptr<haVoc::ScoredMoves,_(__gnu_cxx::_Lock_policy)2>._M_ptr._2_1_ =
       '\0';
  mvs.m_captures.super___shared_ptr<haVoc::ScoredMoves,_(__gnu_cxx::_Lock_policy)2>._M_ptr._3_1_ =
       '\0';
  mvs.m_captures.super___shared_ptr<haVoc::ScoredMoves,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_1_ =
       '\x11';
  local_1f8._M_dataplus._M_p = (pointer)(pos->ifo).key;
  bVar12 = hash_table::fetch(&ttable,(U64 *)&local_1f8,(hash_data *)&mvs);
  bVar11 = true;
  if (bVar12) {
    local_25b = mvs.m_captures.super___shared_ptr<haVoc::ScoredMoves,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr._2_3_;
    hashHits = hashHits + 1;
    ttvalue = (Score)mvs._vptr_Moveorder._4_2_;
    if ((!bVar31) && ((int)(local_260 & 0xffff) <= (int)(char)mvs._vptr_Moveorder)) {
      if (ttvalue < sVar26) {
        if (mvs._vptr_Moveorder._1_1_ == '\x01') {
LAB_001286ff:
          local_1f8._M_dataplus._M_p._0_2_ = (short)local_260;
          haVoc::Movehistory::update
                    (&pos->stats,pos,&local_25b,&stack[-1].curr_move,(int16 *)&local_1f8,&ttvalue,
                     &quiets,stack->killers);
          bVar11 = false;
          SVar25 = ttvalue;
        }
      }
      else if (mvs._vptr_Moveorder._1_1_ == '\0') goto LAB_001286ff;
    }
  }
  if (!bVar11) {
LAB_0012945c:
    if (quiets.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(quiets.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)quiets.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)quiets.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    return SVar25;
  }
  bVar11 = (DAT_00141b78 & (pos->pcs).bitmap._M_elems[1]._M_elems[0]) != 0;
  bVar12 = (DAT_00141ba0 & (pos->pcs).bitmap._M_elems[0]._M_elems[0]) != 0;
  local_208 = (ulong)(ushort)local_260;
  SVar21 = ttvalue;
  if (ttvalue == ninf) {
    SVar21 = stack[-2].static_eval;
    if ((SVar21 == ninf || bVar10) || (SVar21 < stack[-1].static_eval)) {
      SVar21 = ninf;
      if (!bVar10) {
        t = SearchThreads.workers.
            super__Vector_base<Searchthread_*,_std::allocator<Searchthread_*>_>._M_impl.
            super__Vector_impl_data._M_start[pos->thread_id];
        if (bVar11 || bVar12) {
          mvs._vptr_Moveorder._0_4_ = -1.0;
        }
        else {
          local_208._0_4_ = local_260 & 0xffff;
          dVar4 = (double)(uint)local_208;
          dVar4 = exp((dVar4 + -64.0) / 20.0);
          mvs._vptr_Moveorder._0_4_ = (float)((1.0 - dVar4) * 225.0);
        }
        __x_00 = eval::evaluate(pos,t,(float *)&mvs);
        lVar14 = lroundf(__x_00);
        SVar21 = (Score)lVar14;
      }
    }
    else {
      SVar21 = SVar21 + 0xf;
    }
  }
  stack->static_eval = SVar21;
  if ((((bVar10) || (bVar31)) || (stack[-1].curr_move.type != '\n')) ||
     (stack->null_search != false)) {
    bVar30 = false;
  }
  else {
    bVar30 = (((int)local_268 - (int)sVar26) + 1U & 0xfffffffd) == 0 && SVar21 != ninf;
  }
  bVar32 = (pos->ifo).stm != white;
  if (((bVar30) && (5 < (ushort)local_260)) &&
     (((((pos->pcs).bitmap._M_elems[bVar32]._M_elems[2] != 0 ||
        (pos->pcs).bitmap._M_elems[bVar32]._M_elems[1] != 0) ||
       (pos->pcs).bitmap._M_elems[bVar32]._M_elems[3] != 0) ||
       (pos->pcs).bitmap._M_elems[bVar32]._M_elems[4] != 0 &&
      (SVar28 = (Score)sVar26, SVar28 <= SVar21 + (int)local_208 * 8 + 0xfffffe00)))) {
    stack[1].null_search = true;
    position::do_null_move(pos);
    depth_00 = (short)local_260 - (short)(local_208 >> 1);
    if ((short)depth_00 < 2) {
      SVar21 = qsearch<(Nodetype)2>(pos,-sVar26,1 - sVar26,0,stack + 1);
    }
    else {
      SVar21 = search<(Nodetype)2>(pos,-sVar26,1 - sVar26,depth_00,stack + 1);
    }
    position::undo_null_move(pos);
    SVar13 = -SVar21;
    stack[1].null_search = false;
    SVar9 = SVar13;
    if (((SVar28 != SVar13 && SBORROW4(SVar28,SVar13) == SVar28 + SVar21 < 0) &&
        (SVar9 = SVar25, stack[1].best_move.type == '\v')) && (499 < SVar21 + SVar28)) {
      UVar7 = stack[1].best_move.t;
      (stack->threat_move).f = stack[1].best_move.f;
      (stack->threat_move).t = UVar7;
      (stack->threat_move).type = '\v';
    }
    SVar25 = SVar9;
    if (SVar28 == SVar13 || SBORROW4(SVar28,SVar13) != SVar28 + SVar21 < 0) goto LAB_0012945c;
  }
  haVoc::Moveorder::Moveorder(&mvs,pos,&local_25b,stack);
  bVar30 = false;
  move.f = '\0';
  move.t = '\0';
  move.type = '\x11';
  pre_move.f = stack[-1].curr_move.f;
  pre_move.t = stack[-1].curr_move.t;
  pre_move.type = stack[-1].curr_move.type;
  pre_pre_move.f = stack[-2].curr_move.f;
  pre_pre_move.t = stack[-2].curr_move.t;
  pre_pre_move.type = stack[-2].curr_move.type;
  if (sVar19 == 0) {
    pRVar3 = (pos->root_moves).super__Vector_base<Rootmove,_std::allocator<Rootmove>_>._M_impl.
             super__Vector_impl_data._M_start;
    bVar30 = 4 < (ulong)(((long)*(pointer *)
                                 ((long)&(pRVar3->pv).
                                         super__Vector_base<Move,_std::allocator<Move>_>._M_impl + 8
                                 ) -
                         *(long *)&(pRVar3->pv).super__Vector_base<Move,_std::allocator<Move>_>.
                                   _M_impl) * -0x5555555555555555);
  }
  uVar18 = (ulong)(pos->ifo).stm;
  local_1fc = stack[-2].static_eval;
  local_200 = stack->static_eval;
  uVar17 = (uint)(pos->ifo).key & 0x3ff;
  if (searching_positions[uVar17].searching == false) {
    uVar20 = pos->thread_id;
    searching_positions[uVar17].searching = true;
    searching_positions[uVar17].id = (uint)uVar20;
  }
  local_1d4 = (int)local_208 * (int)local_208 + 6U >> (local_200 < local_1fc);
  local_210 = stack + 1;
  local_247 = (ushort)local_260 < 3 || (bVar11 || bVar12);
  local_1d8 = (Score)sVar26;
  local_218 = 0;
  local_1d0 = SVar5;
  do {
    bVar11 = haVoc::Moveorder::next_move
                       (&mvs,pos,&move,&pre_move,&pre_pre_move,&stack->threat_move,false,bVar30);
    if (!bVar11) {
      uVar17 = (uint)(pos->ifo).key & 0x3ff;
      searching_positions[uVar17].searching = false;
      searching_positions[uVar17].id = -1;
      if ((local_268 <= bestScore) && (bestScore < (short)local_1d0)) {
        if (local_263.f != local_263.t) {
          piVar2 = stack->bestMoveHistory->bm[uVar18][local_263.f] + local_263.t;
          *piVar2 = *piVar2 + (int)local_208 * 2;
        }
      }
      SVar25 = draw;
      if (bVar10) {
        SVar25 = uVar16 + mated;
      }
LAB_0012944f:
      haVoc::Moveorder::~Moveorder(&mvs);
      goto LAB_0012945c;
    }
    if (UCI_SIGNALS.stop != false) {
      SVar25 = draw;
      goto LAB_0012944f;
    }
  } while ((move.type == '\x11') || (bVar11 = position::is_legal(pos,&move), !bVar11));
  uVar29 = 0;
  if ((pos->thread_id == 0 && sVar19 == 0) && (3000.0 < elapsed)) {
    local_258 = uVar29;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"info depth ",0xb);
    poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15," currmove ",10);
    uci::move_to_string_abi_cxx11_(&local_1f8,(uci *)&move,m);
    poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar15,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15," currmovenumber ",0x10);
    poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
    std::ostream::put((char)poVar15);
    std::ostream::flush();
    uVar29 = local_258;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
      uVar29 = local_258;
    }
  }
  if ((move.f == local_25b.f) && (move.t == local_25b.t)) {
    bVar11 = true;
    if (move.type == local_25b.type) goto LAB_00128d09;
  }
  if (((((move.f != stack->killers[0].f) || (move.t != stack->killers[0].t)) ||
       (bVar11 = true, move.type != stack->killers[0].type)) &&
      (((move.f != stack->killers[1].f || (move.t != stack->killers[1].t)) ||
       (bVar11 = true, move.type != stack->killers[1].type)))) &&
     (((move.f != stack->killers[2].f || (move.t != stack->killers[2].t)) ||
      (bVar11 = true, move.type != stack->killers[2].type)))) {
    if ((move.f == stack->killers[3].f) && (move.t == stack->killers[3].t)) {
      bVar11 = move.type == stack->killers[3].type;
    }
    else {
      bVar11 = false;
    }
  }
LAB_00128d09:
  bVar12 = position::is_promotion(pos,&move.type);
  local_228 = (Rootmove *)CONCAT71(local_228._1_7_,bVar12);
  local_258 = CONCAT71(local_258._1_7_,1);
  if (1 < (byte)(move.type - 0xb)) {
    local_1f8._M_dataplus._M_p._0_4_ = (uint)move.type;
    bVar12 = position::is_cap_promotion(pos,(Movetype *)&local_1f8);
    local_258 = CONCAT71(local_258._1_7_,bVar12);
  }
  if ((pos->pcs).piece_on._M_elems[move.t] == pawn) {
    if (uVar18 == 0) {
      bVar12 = 0x27 < move.t;
    }
    else {
      bVar12 = move.t < 0x18;
    }
  }
  else {
    bVar12 = false;
  }
  local_248 = stack[-1].curr_move.type == '\v';
  if ((stack->threat_move).type == '\x11') {
    local_21c = 0;
  }
  else {
    local_21c = (uint)((stack->threat_move).f == move.t & (byte)local_258);
  }
  if (move.type == '\n') {
    bVar30 = position::quiet_gives_dangerous_check(pos,&move);
    local_220 = (undefined4)CONCAT71(extraout_var,bVar30);
  }
  else {
    local_220 = 0;
  }
  position::do_move(pos,&move);
  (stack->curr_move).f = move.f;
  (stack->curr_move).t = move.t;
  (stack->curr_move).type = move.type;
  ppVar24 = pos;
  bVar30 = position::in_check(pos);
  uVar20 = 0xffff;
  if ((!bVar31) &&
     (bVar23 = local_1fc <= local_200 | (byte)local_258 | bVar11 | bVar12 | 2 < (ushort)local_260,
     ppVar24 = (position *)(ulong)CONCAT31((int3)((uint)local_200 >> 8),bVar23),
     (((bVar10 || bVar30) | (byte)local_228 | bVar23) & 1) == 0)) {
    uVar20 = local_268 < bestScore | 0xfffe;
  }
  uVar18 = CONCAT71((int7)((ulong)ppVar24 >> 8),2 < (ushort)local_260);
  uVar22 = (ushort)bVar30;
  if ((((local_200 < local_1fc && bVar11 == false) && 2 >= (ushort)local_260) &&
      (local_258 & 1) == 0) && !bVar31) {
    uVar18 = (ulong)(uint)bestScore;
    uVar22 = bVar30 + 1;
    if (((bVar12 | (byte)local_220 | (byte)local_21c) & 1) == 0) {
      uVar22 = (ushort)bVar30;
    }
    if (bestScore < 0xffffd932) {
      uVar22 = (ushort)bVar30;
    }
    if (local_268 <= bestScore) {
      uVar22 = (ushort)bVar30;
    }
  }
  local_218 = (undefined4)CONCAT71((int7)(uVar18 >> 8),local_1d4 <= (uint)uVar29);
  sVar27 = uVar22 + uVar20 + (ushort)local_260;
  stack[1].pv = (Move *)0x0;
  stack[1].pv = pv;
  pv[0].f = '\0';
  pv[0].t = '\0';
  pv[0].type = '\x11';
  if (sVar27 < 2) {
    SVar21 = qsearch<(Nodetype)1>(pos,-sVar26,-local_268,0,local_210);
    local_258._0_4_ = SVar21;
  }
  else {
    SVar21 = search<(Nodetype)1>(pos,-sVar26,-local_268,sVar27 - 1,local_210);
    local_258._0_4_ = SVar21;
  }
  local_258 = CONCAT44(local_258._4_4_,-(Score)local_258);
  if (move.type == '\n') {
    std::vector<Move,std::allocator<Move>>::emplace_back<Move&>
              ((vector<Move,std::allocator<Move>> *)&quiets,&move);
  }
  position::undo_move(pos,&move);
  if (UCI_SIGNALS.stop == false) {
    if (sVar19 == 0) {
      local_228 = (Rootmove *)
                  std::
                  __find_if<__gnu_cxx::__normal_iterator<Rootmove*,std::vector<Rootmove,std::allocator<Rootmove>>>,__gnu_cxx::__ops::_Iter_equals_val<Move_const>>
                            ((pos->root_moves).
                             super__Vector_base<Rootmove,_std::allocator<Rootmove>_>._M_impl.
                             super__Vector_impl_data._M_start,
                             (pos->root_moves).
                             super__Vector_base<Rootmove,_std::allocator<Rootmove>_>._M_impl.
                             super__Vector_impl_data._M_finish,&move);
      local_228->score = (Score)local_258;
      local_228->selDepth = selDepth;
      std::vector<Move,_std::allocator<Move>_>::resize
                ((vector<Move,_std::allocator<Move>_> *)local_228,1);
      __x = stack[1].pv;
      if (__x->f != __x->t) {
        do {
          if (__x->type == '\x11') break;
          std::vector<Move,_std::allocator<Move>_>::push_back(&local_228->pv,__x);
          pvVar1 = __x + 1;
          pvVar6 = __x + 1;
          __x = __x + 1;
        } while (pvVar1->f != pvVar6->t);
      }
    }
    uVar16 = 0;
    if (bestScore < (Score)local_258) {
      bestScore = (Score)local_258;
      UVar7 = move.f;
      UVar8 = move.t;
      local_263.f = move.f;
      local_263.t = move.t;
      local_263.type = move.type;
      (stack->best_move).f = UVar7;
      (stack->best_move).t = UVar8;
      (stack->best_move).type = move.type;
      if (local_1d8 <= (Score)local_258) {
        local_1f8._M_dataplus._M_p._0_2_ = (short)local_260;
        haVoc::Movehistory::update
                  (&pos->stats,pos,&local_263,&stack[-1].curr_move,(int16 *)&local_1f8,&bestScore,
                   &quiets,stack->killers);
        SVar21 = (*(code *)&LAB_00129339)();
        return SVar21;
      }
    }
  }
  else {
    uVar16 = 1;
  }
  SVar21 = (*(code *)((long)&DAT_00132dcc + (long)(int)(&DAT_00132dcc)[uVar16]))();
  return SVar21;
}

Assistant:

Score Search::search(position& pos, int16 alpha, int16 beta, U16 depth, node* stack) {

	if (UCI_SIGNALS.stop)
		return Score::draw;

	assert(alpha < beta);

	Score bestScore = Score::ninf;
	Move best_move = {};
	best_move.type = Movetype::no_type;
	size_t deferred = 0;

	Move ttm = {}; ttm.type = Movetype::no_type; // refactor me
	Move pv[Depth::MAX_PLY + 4];
	Score ttvalue = Score::ninf;

	bool in_check = pos.in_check();
	std::vector<Move> quiets;
	stack->in_check = in_check;
	stack->ply = (stack - 1)->ply + 1;


	U16 root_dist = stack->ply;
	const bool root_node = (type == Nodetype::root && stack->ply == 1);
	const bool pvNode = (root_node || type == Nodetype::pv);
	if (pvNode && selDepth < stack->ply + 1 && main_thread(pos))
		selDepth++;

	if (!root_node && !in_check && pos.is_draw())
			return Score::draw;

	{ // mate distance pruning
		Score mating_score = Score(Score::mate - root_dist);
		beta = std::min(mating_score, Score(beta));
		if (alpha >= mating_score)
			return mating_score;

		Score mated_score = Score(Score::mated + root_dist);
		alpha = std::max(mated_score, Score(alpha));
		if (beta <= mated_score)
			return mated_score;
	}

	// hashtable lookup
	auto hashHit = false;
	{
		hash_data e;
		hashHit = ttable.fetch(pos.key(), e);
		if (hashHit) {
			ttm = e.move;
			hashHits++;
			ttvalue = Score(e.score);
			if (!pvNode &&
				e.depth >= depth &&
				(ttvalue >= beta ? e.bound == bound_low : e.bound == bound_high)) {
				pos.stats_update(ttm, (stack - 1)->curr_move, depth, ttvalue, quiets, stack->killers);
				return ttvalue;
			}
		}
	}

	// static evaluation
	const bool anyPawnsOn7th = pos.pawns_near_promotion(); // either side has pawns on 7th
	const bool weHavePawnsOn7th = pos.pawns_on_7th(); // only side to move has pawns on 7th

	Score static_eval = (ttvalue != Score::ninf ? ttvalue :
		(stack-2)->static_eval != ninf && !in_check && (stack-2)->static_eval >= (stack-1)->static_eval ? Score((stack-2)->static_eval + 15) :
		!in_check ? 
		Score(std::lround(eval::evaluate(pos, *SearchThreads[pos.id()], lazy_eval_margin_search(depth, anyPawnsOn7th)))) :
		Score::ninf);
	 
	//Score static_eval = Score::ninf;
	//if (ttvalue == Score::ninf &&
	//	!pvNode && 
	//	!in_check && 
	//	(stack - 2)->static_eval != Score::ninf &&
	//	(stack - 1)->best_move.type == Movetype::quiet)
	//	static_eval = Score((stack - 2)->static_eval + 33);
	//else if (!in_check)
	//	static_eval = Score(std::lround(eval::evaluate(pos, *SearchThreads[pos.id()], lazy_eval_margin_search(depth, anyPawnsOn7th))));
	stack->static_eval = static_eval;
	bool hasStaticValue = static_eval != Score::ninf;


	// 0. Define the forward pruning conditions
	const bool forward_prune =
		(!in_check &&
		!pvNode &&
		(stack - 1)->curr_move.type == Movetype::quiet &&
		!stack->null_search &&
		abs(alpha - beta) == 1 && // only prune in null windows (same condition as !pv_node)
		hasStaticValue);

	// 1. Futility pruning
	//if (forward_prune &&
	//	!weHavePawnsOn7th &&
	//	depth <= 1 &&
	//	static_eval > mated_max_ply &&
	//	static_eval + 1150 < alpha)
	//	return Score(static_eval);

	// 2. Null move pruning
	bool null_move_allowed = (pos.to_move() == white ?
		pos.non_pawn_material<white>() :
		pos.non_pawn_material<black>());
	if (forward_prune &&
		null_move_allowed &&
		depth >= 6 &&
		static_eval - 8 * (64 - depth) >= beta) {

		int16 R = (depth >= 6 ? depth / 2 : 2);
		int16 ndepth = depth - R;

		(stack + 1)->null_search = true;
		pos.do_null_move();
		Score null_eval = Score(ndepth <= 1 ?
			-qsearch<non_pv>(pos, -beta, -beta + 1, 0, stack + 1) :
			-search<non_pv>(pos, -beta, -beta + 1, ndepth, stack + 1));
		pos.undo_null_move();
		(stack + 1)->null_search = false;


		// verification
		//null_eval = Score(ndepth <= 1 ?
		//	qsearch<non_pv>(pos, beta-1, beta, 0, stack) :
		//	search<non_pv>(pos, beta-1, beta, ndepth, stack));

		if (null_eval >= beta)
			return Score(null_eval);
		else {
			Move tm = (stack + 1)->best_move;
			if (tm.type == Movetype::capture && beta - null_eval >= 500)
				stack->threat_move = tm;
		}
	}

	// Main search
	U16 moves_searched = 0;
	haVoc::Moveorder mvs(pos, ttm, stack);
	Move move;
	Move pre_move = (stack - 1)->curr_move;
	Move pre_pre_move = (stack - 2)->curr_move;
	bool improving = stack->static_eval - (stack - 2)->static_eval >= 0;
	auto to_mv = pos.to_move();
	int SEE = 0;
	auto skipQuiets = false;
	auto rootMoves = root_node && pos.root_moves[0].pv.size() > 4;

	set_searching(pos, {}, pos.id());

	while (mvs.next_move(pos, move, pre_move, pre_pre_move, stack->threat_move, skipQuiets, rootMoves)) {

		if (UCI_SIGNALS.stop)
			return Score::draw;

		if (move.type == Movetype::no_type || !pos.is_legal(move))
			continue;


		if (main_thread(pos) && root_node && elapsed > 3000)
			std::cout << "info depth " << depth
			<< " currmove " << uci::move_to_string(move)
			<< " currmovenumber " << moves_searched << std::endl;

		// Set move data
		auto hashOrKiller = (move == ttm) ||
			(move == stack->killers[0]) ||
			(move == stack->killers[1]) ||
			(move == stack->killers[2]) ||
			(move == stack->killers[3]);
		auto isPromotion = pos.is_promotion(move.type);
		auto isCapture =
			(move.type == Movetype::capture) ||
			(move.type == Movetype::ep) ||
			pos.is_cap_promotion(Movetype(move.type));
		auto isQuiet = move.type == Movetype::quiet;
		auto isEvasion = in_check;
		auto advancedPawnPush = (pos.piece_on(Square(move.t)) == Piece::pawn) &&
			(to_mv == white ? util::row(move.t) >= Row::r6 : util::row(move.t) <= Row::r3);
		auto quietFollowingCapture = (stack - 1)->curr_move.type == Movetype::capture && isQuiet;
		auto quietFollowup = (stack - 1)->curr_move.type == Movetype::quiet && isQuiet;
		auto captureFollowup = (stack - 1)->curr_move.type == Movetype::capture && isCapture;
		auto threatResponse = (stack->threat_move.type != Movetype::no_type && stack->threat_move.f == move.t) && isCapture;
		auto dangerousQuietCheck = isQuiet && pos.quiet_gives_dangerous_check(move);

		// 4. Skip moves with negative see scores
		if (isCapture &&
			!hashOrKiller &&
			!pvNode &&
			!isEvasion &&
			!isPromotion &&
			bestScore < alpha &&
			depth <= 1 &&
			moves_searched > 1 &&
			(SEE = pos.see(move)) < 0)
			continue;

		// Debug viz readout
		//{
		//	std::unique_lock<std::mutex> lock(search_mtx);
		//	std::cout << "moveReadout " <<
		//		"depth=" << depth <<
		//		" m=" << (pos.to_move() == white ? "W" : "B") << "|" <<
		//		SanPiece[pos.piece_on(Square(move.f))] << "|" <<
		//		util::col(move.f) << "|" << util::row(move.f) << "|" <<
		//		util::col(move.t) << "|" << util::row(move.t) << std::endl;
		//}
		
		pos.do_move(move);
		stack->curr_move = move;

		bool givesCheck = pos.in_check();
		int16 extensions = givesCheck;
		int16 reductions = 1;

		// 5. Reduce uninteresting quiet moves
		if (!pvNode &&
			!improving &&
			!hashOrKiller &&
			!isCapture &&
			!isEvasion &&
			!givesCheck &&
			!isPromotion &&
			!advancedPawnPush &&
			depth <= 2 &&
			bestScore <= alpha)
			reductions += 1;

		// 6. Extend likely interesting quiet moves 
		if (!pvNode &&
			!improving &&
			!hashOrKiller &&
			!isCapture &&
			depth <= 2 &&
			bestScore < alpha &&
			bestScore > mated_max_ply &&
			(dangerousQuietCheck || advancedPawnPush || threatResponse))
			extensions += 1;

		// 7. Reduce losing captures
		//if (isCapture &&
		//	!hashOrKiller &&
		//	!givesCheck &&
		//	!isPromotion &&
		//	!isEvasion &&
		//	bestScore < alpha &&
		//	!advancedPawnPush &&
		//	depth <= 1 &&
		//	SEE < 0)
		//	reductions += 1;

		// 8. Movecount pruning from Stockfish
		skipQuiets = moves_searched >= futility_move_count(improving, depth);

		// 9. Reduction if this position is being searched by another thread
		//if (is_searching(pos, move, pos.id()))
		//	reductions += 1;

		int16 newdepth = depth + extensions - reductions;
		(stack + 1)->pv = nullptr;

		Score score = Score::ninf;
		if (moves_searched < 3) {
			(stack + 1)->pv = pv;
			(stack + 1)->pv[0].set(A1, A1, Movetype::no_type);
			score = Score(newdepth <= 1 ? -qsearch<Nodetype::pv>(pos, -beta, -alpha, 0, stack + 1) :
				-search<Nodetype::pv>(pos, -beta, -alpha, newdepth - 1, stack + 1));
		}
		else {
			int16 LMR = newdepth;
			// Late move reduction for moves unlikely to raise alpha
			if (!threatResponse &&
				!hashOrKiller &&
				!dangerousQuietCheck &&
				!captureFollowup &&
				!advancedPawnPush &&
				!isPromotion &&
				!isEvasion &&
				!givesCheck &&
				!anyPawnsOn7th &&
				depth >= 3 &&
				bestScore <= alpha) {
				unsigned R = reduction(pvNode, improving, depth, moves_searched);
				LMR -= R;
			}

			score = Score(LMR <= 1 ? -qsearch<non_pv>(pos, -alpha - 1, -alpha, 0, stack + 1) :
				-search<non_pv>(pos, -alpha - 1, -alpha, LMR - 1, stack + 1));

			if (score > alpha) {
				(stack + 1)->pv = pv;
				(stack + 1)->pv[0].set(A1, A1, Movetype::no_type);

				score = Score(newdepth <= 1 ? -qsearch<Nodetype::pv>(pos, -beta, -alpha, 0, stack + 1) :
					-search<Nodetype::pv>(pos, -beta, -alpha, newdepth - 1, stack + 1));
			}
		}
		++moves_searched;

		if (move.type == Movetype::quiet)
			quiets.emplace_back(move);


		pos.undo_move(move);

		// return if stop requested - do not updated best move or pv
		if (UCI_SIGNALS.stop)
			return Score::draw;


		// root move update
		if (root_node) {
			auto& rm = *std::find(pos.root_moves.begin(), pos.root_moves.end(), move);

			if (moves_searched == 1 || score > alpha) {
				rm.score = score;
				rm.selDepth = selDepth;
				rm.pv.resize(1);
				for (Move* m = (stack + 1)->pv;; ++m) {
					if (m->f == m->t || m->type == Movetype::no_type)
						break;
					rm.pv.push_back(*m);
				}
			}
			else rm.score = Score::ninf;
		}

		if (score > bestScore) {
			bestScore = score;
			best_move = move;
			stack->best_move = move;

			if (score >= beta) {
				// Update mate killers and quiet move stats
				pos.stats_update(best_move,
					(stack - 1)->curr_move,
					depth, bestScore, quiets, stack->killers);
				break;
			}

			if (score > alpha) {

				if (pvNode)
					alpha = score;

				if (pvNode && !root_node)
					update_pv(stack->pv, move, (stack + 1)->pv);
			}
		}


		// Penalize captures failing to raise alpha
		//if (SEE >= 0 && !pv && score < alpha && move.f != move.t && move.type == Movetype::capture) {
		//	auto capturePenalty = 2 * depth;
		//	stack->capHistory[to_mv][move.f][move.t] -= capturePenalty;
		//}

	} // end moves loop




	unset_searching(pos, {});

	// Update best move stats
	auto bestMoveBonus = 2 * depth;
	if (bestScore >= alpha && bestScore < beta && best_move.f != best_move.t) {
		stack->bestMoveHistory->bm[to_mv][best_move.f][best_move.t] += bestMoveBonus;
	}



	if (moves_searched == 0) {
		return (in_check ? Score(Score::mated + root_dist) : Score::draw);
	}

	Bound bound = (bestScore >= beta ? bound_low :
		pvNode && (best_move.type != Movetype::no_type) ? bound_exact : bound_high);
	ttable.save(pos.key(), depth, U8(bound), stack->ply, best_move, bestScore, pvNode);

	return bestScore;
}